

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O2

uint16_t read_uint16(dwarf_buf *buf)

{
  ushort *puVar1;
  ushort uVar2;
  int iVar3;
  
  puVar1 = (ushort *)buf->buf;
  iVar3 = advance(buf,2);
  if (iVar3 == 0) {
    uVar2 = 0;
  }
  else if (buf->is_bigendian == 0) {
    uVar2 = *puVar1;
  }
  else {
    uVar2 = *puVar1;
    uVar2 = uVar2 << 8 | uVar2 >> 8;
  }
  return uVar2;
}

Assistant:

static uint16_t
read_uint16 (struct dwarf_buf *buf)
{
  const unsigned char *p = buf->buf;

  if (!advance (buf, 2))
    return 0;
  if (buf->is_bigendian)
    return ((uint16_t) p[0] << 8) | (uint16_t) p[1];
  else
    return ((uint16_t) p[1] << 8) | (uint16_t) p[0];
}